

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O2

void __thiscall Storage::Disk::Drive::set_motor_on(Drive *this,bool motor_is_on)

{
  IntType IVar1;
  
  if (this->motor_input_is_on_ != motor_is_on) {
    this->motor_input_is_on_ = motor_is_on;
    if (this->disk_is_rotating_ != motor_is_on) {
      if (!motor_is_on) {
        if ((this->time_until_motor_transition).super_WrappedInt<Cycles>.length_ != 0) {
          return;
        }
        IVar1 = TimedEventLoop::get_input_clock_rate(&this->super_TimedEventLoop);
        (this->time_until_motor_transition).super_WrappedInt<Cycles>.length_ = IVar1;
        return;
      }
      set_disk_is_rotating(this,true);
    }
    (this->time_until_motor_transition).super_WrappedInt<Cycles>.length_ = 0;
  }
  return;
}

Assistant:

void Drive::set_motor_on(bool motor_is_on) {
	// Do nothing if the input hasn't changed.
	if(motor_input_is_on_ == motor_is_on) return;
	motor_input_is_on_ = motor_is_on;

	// If this now means that the input and the actual state are in harmony,
	// cancel any planned change and stop.
	if(disk_is_rotating_ == motor_is_on) {
		time_until_motor_transition = Cycles(0);
		return;
	}

	// If this is a transition to on, start immediately.
	// TODO: spin-up?
	// TODO: momentum.
	if(motor_is_on) {
		set_disk_is_rotating(true);
		time_until_motor_transition = Cycles(0);
		return;
	}

	// This is a transition from on to off. Simulate momentum (ha!)
	// by delaying the time until complete standstill.
	if(time_until_motor_transition == Cycles(0))
		time_until_motor_transition = get_input_clock_rate();
}